

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticFacts.cpp
# Opt level: O0

pair<std::optional<slang::ast::DriveStrength>,_std::optional<slang::ast::DriveStrength>_>
slang::ast::SemanticFacts::getDriveStrength(NetStrengthSyntax *syntax)

{
  TokenKind kind_00;
  bool bVar1;
  PullStrengthSyntax *pPVar2;
  SyntaxNode *in_RDI;
  DriveStrength val;
  TokenKind kind;
  DriveStrength val1;
  DriveStrength val0;
  DriveStrengthSyntax *ds;
  optional<slang::ast::DriveStrength> *in_stack_ffffffffffffffa8;
  _Optional_payload_base<slang::ast::DriveStrength> in_stack_ffffffffffffffb0;
  _Optional_payload_base<slang::ast::DriveStrength> in_stack_ffffffffffffffb8;
  pair<std::optional<slang::ast::DriveStrength>,_std::optional<slang::ast::DriveStrength>_>
  *in_stack_ffffffffffffffc0;
  DriveStrength local_28;
  DriveStrength local_24;
  DriveStrengthSyntax *local_20;
  pair<std::optional<slang::ast::DriveStrength>,_std::optional<slang::ast::DriveStrength>_> local_10
  ;
  
  if (in_RDI->kind == DriveStrength) {
    local_20 = slang::syntax::SyntaxNode::as<slang::syntax::DriveStrengthSyntax>(in_RDI);
    local_24 = getDriveStrengthVal((local_20->strength0).kind);
    local_28 = getDriveStrengthVal((local_20->strength1).kind);
    bVar1 = slang::syntax::SyntaxFacts::isStrength0((local_20->strength1).kind);
    if (bVar1) {
      std::swap<slang::ast::DriveStrength>(&local_24,&local_28);
    }
    std::pair<std::optional<slang::ast::DriveStrength>,_std::optional<slang::ast::DriveStrength>_>::
    pair<slang::ast::DriveStrength_&,_slang::ast::DriveStrength_&,_true>
              (in_stack_ffffffffffffffc0,(DriveStrength *)in_stack_ffffffffffffffb8,
               (DriveStrength *)in_stack_ffffffffffffffb0);
  }
  else if (in_RDI->kind == PullStrength) {
    pPVar2 = slang::syntax::SyntaxNode::as<slang::syntax::PullStrengthSyntax>(in_RDI);
    kind_00 = (pPVar2->strength).kind;
    getDriveStrengthVal(kind_00);
    bVar1 = slang::syntax::SyntaxFacts::isStrength0(kind_00);
    if (bVar1) {
      std::optional<slang::ast::DriveStrength>::optional
                ((optional<slang::ast::DriveStrength> *)0xa06bfd);
      std::pair<std::optional<slang::ast::DriveStrength>,_std::optional<slang::ast::DriveStrength>_>
      ::pair<slang::ast::DriveStrength_&,_true>
                (in_stack_ffffffffffffffc0,(DriveStrength *)in_stack_ffffffffffffffb8,
                 (optional<slang::ast::DriveStrength> *)in_stack_ffffffffffffffb0);
    }
    else {
      std::optional<slang::ast::DriveStrength>::optional
                ((optional<slang::ast::DriveStrength> *)0xa06c1d);
      std::pair<std::optional<slang::ast::DriveStrength>,_std::optional<slang::ast::DriveStrength>_>
      ::pair<slang::ast::DriveStrength_&,_true>
                ((pair<std::optional<slang::ast::DriveStrength>,_std::optional<slang::ast::DriveStrength>_>
                  *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,(DriveStrength *)0xa06c31);
    }
  }
  else {
    std::optional<slang::ast::DriveStrength>::optional
              ((optional<slang::ast::DriveStrength> *)0xa06c3d);
    std::optional<slang::ast::DriveStrength>::optional
              ((optional<slang::ast::DriveStrength> *)0xa06c47);
    std::pair<std::optional<slang::ast::DriveStrength>,_std::optional<slang::ast::DriveStrength>_>::
    pair<std::optional<slang::ast::DriveStrength>,_std::optional<slang::ast::DriveStrength>,_true>
              (&local_10,(optional<slang::ast::DriveStrength> *)&stack0xffffffffffffffb8,
               (optional<slang::ast::DriveStrength> *)&stack0xffffffffffffffb0);
  }
  return local_10;
}

Assistant:

std::pair<std::optional<DriveStrength>, std::optional<DriveStrength>> SemanticFacts::
    getDriveStrength(const syntax::NetStrengthSyntax& syntax) {

    if (syntax.kind == SyntaxKind::DriveStrength) {
        auto& ds = syntax.as<DriveStrengthSyntax>();
        auto val0 = getDriveStrengthVal(ds.strength0.kind);
        auto val1 = getDriveStrengthVal(ds.strength1.kind);
        if (SyntaxFacts::isStrength0(ds.strength1.kind))
            std::swap(val0, val1);

        return {val0, val1};
    }
    else if (syntax.kind == SyntaxKind::PullStrength) {
        auto kind = syntax.as<PullStrengthSyntax>().strength.kind;
        auto val = getDriveStrengthVal(kind);
        if (SyntaxFacts::isStrength0(kind))
            return {val, {}};
        else
            return {{}, val};
    }
    else {
        return {{}, {}};
    }
}